

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Projection.cpp
# Opt level: O0

void __thiscall
Projection::ConvertUnew(Projection *this,FArrayBox *Unew,FArrayBox *Uold,Real alpha,Box *grd)

{
  long in_RDX;
  long in_RSI;
  Real dt_inv;
  Array4<double> *uold;
  Array4<double> *unew;
  undefined1 local_338 [64];
  anon_class_136_3_abc813dd *in_stack_fffffffffffffd08;
  int in_stack_fffffffffffffd14;
  Box *in_stack_fffffffffffffd18;
  Array4<double> local_2a8;
  Array4<double> *local_268;
  Array4<double> local_260;
  Array4<double> *local_220;
  long local_208;
  long local_1f0;
  Dim3 local_1e0;
  Dim3 local_1d0;
  Dim3 local_1c0;
  Dim3 local_1b0;
  int local_1a4;
  undefined8 *local_1a0;
  double *local_198;
  Dim3 local_190;
  undefined8 *local_180;
  undefined4 local_178;
  undefined4 uStack_174;
  int local_170;
  undefined4 local_16c;
  undefined8 *local_168;
  undefined4 local_15c;
  undefined8 *local_158;
  undefined4 local_14c;
  undefined8 *local_148;
  Dim3 local_140;
  undefined8 *local_130;
  int local_128;
  int iStack_124;
  int local_120;
  undefined4 local_11c;
  long local_118;
  undefined4 local_10c;
  long local_108;
  undefined4 local_fc;
  int *local_f8;
  Dim3 local_f0;
  Dim3 local_dc;
  Dim3 local_d0;
  Dim3 local_c0;
  int local_b4;
  undefined8 *local_b0;
  double *local_a8;
  Dim3 local_a0;
  undefined8 *local_90;
  undefined4 local_88;
  undefined4 uStack_84;
  int local_80;
  undefined4 local_7c;
  undefined8 *local_78;
  undefined4 local_6c;
  undefined8 *local_68;
  undefined4 local_5c;
  undefined8 *local_58;
  Dim3 local_50;
  undefined8 *local_40;
  int local_38;
  int iStack_34;
  int local_30;
  undefined4 local_2c;
  long local_28;
  undefined4 local_1c;
  long local_18;
  undefined4 local_c;
  int *local_8;
  
  local_198 = *(double **)(in_RSI + 0x10);
  local_1a0 = (undefined8 *)(in_RSI + 0x18);
  local_1a4 = *(int *)(in_RSI + 0x34);
  local_14c = 0;
  local_178 = *(undefined4 *)local_1a0;
  local_15c = 1;
  uStack_174 = *(undefined4 *)(in_RSI + 0x1c);
  local_1c0._0_8_ = *local_1a0;
  local_16c = 2;
  local_1c0.z = *(int *)(in_RSI + 0x20);
  local_f8 = (int *)(in_RSI + 0x24);
  local_fc = 0;
  local_128 = *local_f8 + 1;
  local_108 = in_RSI + 0x24;
  local_10c = 1;
  iStack_124 = *(int *)(in_RSI + 0x28) + 1;
  local_118 = in_RSI + 0x24;
  local_11c = 2;
  local_1e0.z = *(int *)(in_RSI + 0x2c) + 1;
  local_1e0.y = iStack_124;
  local_1e0.x = local_128;
  local_208 = in_RDX;
  local_1d0._0_8_ = local_1e0._0_8_;
  local_1d0.z = local_1e0.z;
  local_1b0._0_8_ = local_1c0._0_8_;
  local_1b0.z = local_1c0.z;
  local_190._0_8_ = local_1c0._0_8_;
  local_190.z = local_1c0.z;
  local_180 = local_1a0;
  local_170 = local_1c0.z;
  local_168 = local_1a0;
  local_158 = local_1a0;
  local_148 = local_1a0;
  local_140._0_8_ = local_1e0._0_8_;
  local_140.z = local_1e0.z;
  local_130 = local_1a0;
  local_120 = local_1e0.z;
  amrex::Array4<double>::Array4(&local_260,local_198,&local_1b0,&local_1d0,local_1a4);
  local_1f0 = local_208;
  local_a8 = *(double **)(local_208 + 0x10);
  local_b0 = (undefined8 *)(local_208 + 0x18);
  local_b4 = *(int *)(local_208 + 0x34);
  local_5c = 0;
  local_88 = *(undefined4 *)local_b0;
  local_6c = 1;
  uStack_84 = *(undefined4 *)(local_208 + 0x1c);
  local_d0._0_8_ = *local_b0;
  local_7c = 2;
  local_d0.z = *(int *)(local_208 + 0x20);
  local_8 = (int *)(local_208 + 0x24);
  local_c = 0;
  local_38 = *local_8 + 1;
  local_18 = local_208 + 0x24;
  local_1c = 1;
  iStack_34 = *(int *)(local_208 + 0x28) + 1;
  local_28 = local_208 + 0x24;
  local_2c = 2;
  local_f0.z = *(int *)(local_208 + 0x2c) + 1;
  local_f0.y = iStack_34;
  local_f0.x = local_38;
  local_220 = &local_260;
  local_dc._0_8_ = local_f0._0_8_;
  local_dc.z = local_f0.z;
  local_c0._0_8_ = local_d0._0_8_;
  local_c0.z = local_d0.z;
  local_a0._0_8_ = local_d0._0_8_;
  local_a0.z = local_d0.z;
  local_90 = local_b0;
  local_80 = local_d0.z;
  local_78 = local_b0;
  local_68 = local_b0;
  local_58 = local_b0;
  local_50._0_8_ = local_f0._0_8_;
  local_50.z = local_f0.z;
  local_40 = local_b0;
  local_30 = local_f0.z;
  amrex::Array4<double>::Array4(&local_2a8,local_a8,&local_c0,&local_dc,local_b4);
  local_268 = &local_2a8;
  memcpy(local_338,local_220,0x3c);
  memcpy(&stack0xfffffffffffffd08,local_268,0x3c);
  amrex::
  ParallelFor<int,Projection::ConvertUnew(amrex::FArrayBox&,amrex::FArrayBox&,double,amrex::Box_const&)::__0,void>
            (in_stack_fffffffffffffd18,in_stack_fffffffffffffd14,in_stack_fffffffffffffd08);
  return;
}

Assistant:

void
Projection::ConvertUnew( FArrayBox &Unew, FArrayBox &Uold, Real alpha,
                              const Box &grd )
{
    AMREX_ASSERT(Unew.nComp() >= AMREX_SPACEDIM);
    AMREX_ASSERT(Uold.nComp() >= AMREX_SPACEDIM);
    AMREX_ASSERT(Unew.contains(grd) == true);
    AMREX_ASSERT(Uold.contains(grd) == true);

    const auto& unew = Unew.array();
    const auto& uold = Uold.array();
    const Real dt_inv = 1.0/alpha;
    amrex::ParallelFor(grd, AMREX_SPACEDIM, [unew,uold,dt_inv]
    AMREX_GPU_DEVICE (int i, int j, int k, int n) noexcept
    {
       unew(i,j,k,n) -= uold(i,j,k,n);
       unew(i,j,k,n) *= dt_inv;
    });
}